

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O2

size_t interpretBase(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm)

{
  UInt32 *pUVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  char (*__s) [8];
  
  if (((pMyDisasm->Reserved_).BASE_ == 5) && ((pMyDisasm->Reserved_).MOD_ == 0)) {
    pUVar1 = &(pMyDisasm->Reserved_).DECALAGE_EIP;
    *pUVar1 = *pUVar1 + 4;
    iVar2 = Security(7,pMyDisasm);
    if (iVar2 != 0) {
      sVar4 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i,"%.8X",
                                  (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 3));
      i = i + sVar4;
      (pMyOperand->Memory).Displacement = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 3);
    }
  }
  else {
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
      pMyOperand->OpMnemonic[i + 2] = '\0';
      (pMyOperand->OpMnemonic + i)[0] = '(';
      (pMyOperand->OpMnemonic + i)[1] = '%';
      i = i + 2;
    }
    iVar2 = (pMyDisasm->Reserved_).AddressSize;
    if (iVar2 == 0x20) {
      lVar3 = (long)(pMyDisasm->Reserved_).BASE_;
      if ((pMyDisasm->Reserved_).REX.B_ == '\0') {
        strcpy(pMyOperand->OpMnemonic + i,Registers32Bits[lVar3]);
        iVar2 = (pMyDisasm->Reserved_).BASE_;
        (pMyOperand->Memory).BaseRegister = REGS[iVar2];
        __s = Registers32Bits + iVar2;
      }
      else {
        strcpy(pMyOperand->OpMnemonic + i,Registers32Bits[lVar3 + 8]);
        lVar3 = (long)(pMyDisasm->Reserved_).BASE_;
        (pMyOperand->Memory).BaseRegister = REGS[lVar3 + 8];
        __s = Registers32Bits + lVar3 + 8;
      }
    }
    else {
      if (iVar2 != 0x40) {
        return i;
      }
      lVar3 = (long)(pMyDisasm->Reserved_).BASE_;
      if ((pMyDisasm->Reserved_).REX.B_ == '\0') {
        strcpy(pMyOperand->OpMnemonic + i,Registers64Bits[lVar3]);
        iVar2 = (pMyDisasm->Reserved_).BASE_;
        (pMyOperand->Memory).BaseRegister = REGS[iVar2];
        __s = (char (*) [8])(Registers64Bits + iVar2);
      }
      else {
        strcpy(pMyOperand->OpMnemonic + i,Registers64Bits[lVar3 + 8]);
        lVar3 = (long)(pMyDisasm->Reserved_).BASE_;
        (pMyOperand->Memory).BaseRegister = REGS[lVar3 + 8];
        __s = (char (*) [8])(Registers64Bits + lVar3 + 8);
      }
    }
    sVar5 = strlen(*__s);
    i = i + sVar5;
  }
  return i;
}

Assistant:

size_t __bea_callspec__ interpretBase(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm)
{
  size_t j;
  if ((GV.BASE_  == 5) && (GV.MOD_ == 0)) {
    GV.DECALAGE_EIP += 4;
    if (!Security(7, pMyDisasm)) return i;
    j = i;
    #ifndef BEA_LIGHT_DISASSEMBLY
       i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) *((UInt32*) (GV.EIP_+3)));
    #endif
    pMyOperand->Memory.Displacement = *((UInt32*) (GV.EIP_+3));
  }
  else {
    if (GV.SYNTAX_ == ATSyntax) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(%");
      #endif
      i += 2;
    }
    if (GV.AddressSize == 64) {
      if (GV.REX.B_ == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers64Bits[GV.BASE_ ]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ ];
        i += strlen(Registers64Bits[GV.BASE_ ]);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers64Bits[GV.BASE_ +8]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ +8];
        i += strlen( Registers64Bits[GV.BASE_ +8]);
      }
    }
    else if (GV.AddressSize == 32) {
      if (GV.REX.B_ == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers32Bits[GV.BASE_ ]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ ];
        i += strlen( Registers32Bits[GV.BASE_ ]);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers32Bits[GV.BASE_ +8]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ +8];
        i += strlen( Registers32Bits[GV.BASE_ +8]);
      }
    }
  }
  return i;
}